

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::ExtensionSet(ExtensionSet *this,Arena *arena)

{
  ulong n_00;
  unsigned_long uVar1;
  LogMessage *other;
  long in_RSI;
  long *in_RDI;
  size_t n;
  LogMessage *in_stack_fffffffffffffeb8;
  LogMessage *in_stack_fffffffffffffec0;
  LogMessage *in_stack_fffffffffffffec8;
  LogMessage *in_stack_fffffffffffffed0;
  Arena *this_00;
  ArenaImpl *in_stack_fffffffffffffee0;
  void *local_f8;
  void *local_70;
  LogMessage local_48;
  ulong local_10;
  Arena *local_8;
  
  *in_RDI = in_RSI;
  *(undefined2 *)(in_RDI + 1) = 0;
  *(undefined2 *)((long)in_RDI + 10) = 0;
  if ((short)in_RDI[1] == 0) {
    local_f8 = (void *)0x0;
  }
  else {
    this_00 = (Arena *)*in_RDI;
    n_00 = (ulong)*(ushort *)(in_RDI + 1);
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 >> 5 < n_00) {
      LogMessage::LogMessage
                (in_stack_fffffffffffffed0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      LogMessage::~LogMessage((LogMessage *)0x483d10);
    }
    if (this_00 == (Arena *)0x0) {
      local_70 = operator_new__(n_00 << 5);
    }
    else {
      local_10 = n_00;
      local_8 = this_00;
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 >> 5 < n_00) {
        in_stack_fffffffffffffec0 = &local_48;
        LogMessage::LogMessage
                  ((LogMessage *)this_00,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                  );
        in_stack_fffffffffffffec8 =
             LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        other = LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffec0,other);
        LogMessage::~LogMessage((LogMessage *)0x483e57);
      }
      AlignUpTo8(local_10 << 5);
      Arena::AllocHook(this_00,(type_info *)in_stack_fffffffffffffec8,
                       (size_t)in_stack_fffffffffffffec0);
      local_70 = ArenaImpl::AllocateAligned(in_stack_fffffffffffffee0,n_00);
    }
    local_f8 = local_70;
  }
  in_RDI[2] = (long)local_f8;
  return;
}

Assistant:

ExtensionSet::ExtensionSet(Arena* arena)
    : arena_(arena),
      flat_capacity_(0),
      flat_size_(0),
      map_{flat_capacity_ == 0
               ? NULL
               : Arena::CreateArray<KeyValue>(arena_, flat_capacity_)} {}